

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonestack.cpp
# Opt level: O2

void __thiscall
asmjit::ZoneStackBase::_cleanupBlock(ZoneStackBase *this,uint32_t side,size_t middleIndex)

{
  Block *p;
  Block *pBVar1;
  int line;
  void *pvVar2;
  char *msg;
  
  p = this->_block[side];
  if (p->_start != p->_end) {
    msg = "block->empty()";
    line = 0x5f;
LAB_00120a0f:
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_c_cmakelists/comsec-group[P]blacksmith/build_O2/_deps/asmjit-src/src/asmjit/core/zonestack.cpp"
               ,line,msg);
  }
  pBVar1 = p->_link[side == 0];
  if (pBVar1 == (Block *)0x0) {
    if (this->_block[side == 0] == p) {
      pvVar2 = (void *)((long)p->_link + middleIndex);
      p->_start = pvVar2;
      p->_end = pvVar2;
    }
  }
  else {
    if (pBVar1->_link[side] != p) {
      msg = "prev->_link[side] == block";
      line = 99;
      goto LAB_00120a0f;
    }
    ZoneAllocator::release(this->_allocator,p,0x200);
    pBVar1->_link[side] = (Block *)0x0;
    this->_block[side] = pBVar1;
  }
  return;
}

Assistant:

void ZoneStackBase::_cleanupBlock(uint32_t side, size_t middleIndex) noexcept {
  Block* block = _block[side];
  ASMJIT_ASSERT(block->empty());

  Block* prev = block->_link[!side];
  if (prev) {
    ASMJIT_ASSERT(prev->_link[side] == block);
    _allocator->release(block, kBlockSize);

    prev->_link[side] = nullptr;
    _block[side] = prev;
  }
  else if (_block[!side] == block) {
    // If the container becomes empty center both pointers in the remaining block.
    block->_start = (uint8_t*)block + middleIndex;
    block->_end = (uint8_t*)block + middleIndex;
  }
}